

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spooky.cpp
# Opt level: O0

void __thiscall SpookyHash::Final(SpookyHash *this,uint64 *hash1,uint64 *hash2)

{
  byte bVar1;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  uint64 *in_RDI;
  uint64 h11;
  uint64 h10;
  uint64 h9;
  uint64 h8;
  uint64 h7;
  uint64 h6;
  uint64 h5;
  uint64 h4;
  uint64 h3;
  uint64 h2;
  uint64 h1;
  uint64 h0;
  uint8 remainder;
  uint64 *data;
  uint64 *puVar2;
  uint64 *s6;
  uint64 *s7;
  uint64 *s8;
  uint64 *s9;
  uint64 *s10;
  uint64 *s11;
  uint64 local_78;
  uint64 *h6_00;
  uint64 *h7_00;
  uint64 *h8_00;
  uint64 *h9_00;
  uint64 *h10_00;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  uint64 *in_stack_ffffffffffffffc0;
  
  if (in_RDI[0x24] < 0xc0) {
    Short(in_RSI,(size_t)in_RDX,in_stack_ffffffffffffffc0,
          (uint64 *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  }
  else {
    bVar1 = (byte)in_RDI[0x25];
    h10_00 = (uint64 *)in_RDI[0x18];
    h9_00 = (uint64 *)in_RDI[0x19];
    h8_00 = (uint64 *)in_RDI[0x1a];
    h7_00 = (uint64 *)in_RDI[0x1b];
    h6_00 = (uint64 *)in_RDI[0x1c];
    local_78 = in_RDI[0x1d];
    s11 = (uint64 *)in_RDI[0x1e];
    s10 = (uint64 *)in_RDI[0x1f];
    s9 = (uint64 *)in_RDI[0x20];
    s8 = (uint64 *)in_RDI[0x21];
    s7 = (uint64 *)in_RDI[0x22];
    s6 = (uint64 *)in_RDI[0x23];
    puVar2 = in_RDI;
    if (0x5f < bVar1) {
      Mix((uint64 *)&stack0xffffffffffffff60,(uint64 *)&stack0xffffffffffffff68,
          (uint64 *)&stack0xffffffffffffff70,(uint64 *)&stack0xffffffffffffff78,
          (uint64 *)&stack0xffffffffffffff80,&local_78,in_RDI,s6,s7,s8,s9,s10,s11);
      puVar2 = puVar2 + 0xc;
      bVar1 = bVar1 + 0xa0;
    }
    memset((void *)((long)puVar2 + (ulong)bVar1),0,0x60 - (ulong)bVar1);
    *(byte *)((long)puVar2 + 0x5f) = bVar1;
    puVar2 = (uint64 *)&stack0xffffffffffffff58;
    Mix((uint64 *)&stack0xffffffffffffff60,(uint64 *)&stack0xffffffffffffff68,
        (uint64 *)&stack0xffffffffffffff70,(uint64 *)&stack0xffffffffffffff78,
        (uint64 *)&stack0xffffffffffffff80,&local_78,in_RDI,s6,s7,s8,s9,s10,s11);
    End(s8,s7,s6,in_RDI,puVar2,(uint64 *)&stack0xffffffffffffff58,h6_00,h7_00,h8_00,h9_00,h10_00,
        (uint64 *)CONCAT17(bVar1,in_stack_ffffffffffffffb8));
    *in_RSI = h10_00;
    *in_RDX = h9_00;
  }
  return;
}

Assistant:

void SpookyHash::Final(uint64 *hash1, uint64 *hash2)
{
    // init the variables
    if (m_length < sc_bufSize)
    {
        Short( m_data, m_length, hash1, hash2);
        return;
    }
    
    const uint64 *data = (const uint64 *)m_data;
    uint8 remainder = m_remainder;
    
    uint64 h0 = m_state[0];
    uint64 h1 = m_state[1];
    uint64 h2 = m_state[2];
    uint64 h3 = m_state[3];
    uint64 h4 = m_state[4];
    uint64 h5 = m_state[5];
    uint64 h6 = m_state[6];
    uint64 h7 = m_state[7];
    uint64 h8 = m_state[8];
    uint64 h9 = m_state[9];
    uint64 h10 = m_state[10];
    uint64 h11 = m_state[11];

    if (remainder >= sc_blockSize)
    {
        // m_data can contain two blocks; handle any whole first block
        Mix(data, h0,h1,h2,h3,h4,h5,h6,h7,h8,h9,h10,h11);
	data += sc_numVars;
	remainder -= sc_blockSize;
    }

    // mix in the last partial block, and the length mod sc_blockSize
    memset(&((uint8 *)data)[remainder], 0, (sc_blockSize-remainder));

    ((uint8 *)data)[sc_blockSize-1] = remainder;
    Mix(data, h0,h1,h2,h3,h4,h5,h6,h7,h8,h9,h10,h11);
    
    // do some final mixing
    End(h0,h1,h2,h3,h4,h5,h6,h7,h8,h9,h10,h11);

    *hash1 = h0;
    *hash2 = h1;
}